

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::ContainsMapKey
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key)

{
  bool bVar1;
  MapFieldBase *this_00;
  
  if (field->type_ == '\v') {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    if (bVar1) {
      this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      internal::MapFieldBase::SyncMapWithRepeatedField(this_00);
      bVar1 = internal::MapFieldBase::LookupMapValueNoSync(this_00,key,(MapValueConstRef *)0x0);
      return bVar1;
    }
  }
  anon_unknown_6::ReportReflectionUsageError
            (this->descriptor_,field,"LookupMapValue","Field is not a map field.");
}

Assistant:

bool Reflection::ContainsMapKey(const Message& message,
                                const FieldDescriptor* field,
                                const MapKey& key) const {
  USAGE_CHECK(IsMapFieldInApi(field), LookupMapValue,
              "Field is not a map field.");
  return GetRaw<MapFieldBase>(message, field).ContainsMapKey(key);
}